

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint32_t helper_float_rsqrt2_s_mips64el(CPUMIPSState_conflict10 *env,uint32_t fst0,uint32_t fst2)

{
  float_status *s;
  byte bVar1;
  uint uVar2;
  float32 fVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar3 = float32_mul_mips64el(fst0,fst2,s);
  fVar3 = float32_sub_mips64el(fVar3,0x3f800000,s);
  fVar3 = float32_div_mips64el(fVar3,0x40000000,s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar2 = (env->active_fpu).fcr31;
  uVar5 = uVar4 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar5;
  if (uVar4 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar2 >> 7 & uVar4) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar5 | uVar4 << 2;
  }
  return fVar3 + 0x80000000;
}

Assistant:

uint32_t helper_float_rsqrt2_s(CPUMIPSState *env, uint32_t fst0, uint32_t fst2)
{
    fst2 = float32_mul(fst0, fst2, &env->active_fpu.fp_status);
    fst2 = float32_sub(fst2, float32_one, &env->active_fpu.fp_status);
    fst2 = float32_chs(float32_div(fst2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fst2;
}